

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_window.c
# Opt level: O0

GLFWbool createNativeWindow(_GLFWwindow *window,_GLFWwndconfig *wndconfig,Visual *visual,int depth)

{
  GLFWbool GVar1;
  __pid_t _Var2;
  Colormap CVar3;
  Window WVar4;
  XWMHints *pXVar5;
  XSizeHints *pXVar6;
  XClassHint *pXVar7;
  size_t sVar8;
  char *__s;
  int in_ECX;
  int iVar9;
  Visual *in_RDX;
  int *in_RSI;
  char *in_RDI;
  Atom version;
  char *resourceName;
  XClassHint *hint;
  XSizeHints *hints_1;
  XWMHints *hints;
  Atom type;
  long pid;
  Atom protocols [2];
  int count;
  Atom states [3];
  XSetWindowAttributes wa;
  int ypos;
  int xpos;
  int height;
  int width;
  char *in_stack_000002a8;
  int in_stack_000002b4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int *xpos_00;
  _GLFWwindow *window_00;
  GLFWbool in_stack_fffffffffffffedc;
  _GLFWwindow *in_stack_fffffffffffffee0;
  Atom local_f8;
  long local_f0;
  char *title;
  _GLFWwindow *window_01;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  int *in_stack_ffffffffffffff38;
  _GLFWwindow *in_stack_ffffffffffffff40;
  _GLFWwindow *in_stack_ffffffffffffff68;
  int local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  GLFWbool local_c;
  
  local_30 = in_RSI[2];
  local_34 = in_RSI[3];
  if (in_RSI[0x10] != 0) {
    local_30 = (uint)((float)(int)local_30 * _glfw.x11.contentScaleX);
    local_34 = (uint)((float)(int)local_34 * _glfw.x11.contentScaleY);
  }
  local_38 = 0;
  local_3c = 0;
  if ((*in_RSI != -0x80000000) && (in_RSI[1] != -0x80000000)) {
    local_38 = *in_RSI;
    local_3c = in_RSI[1];
  }
  CVar3 = (*_glfw.x11.xlib.CreateColormap)(_glfw.x11.display,_glfw.x11.root,in_RDX,0);
  *(Colormap *)(in_RDI + 0x4d8) = CVar3;
  GVar1 = _glfwIsVisualTransparentX11
                    ((Visual *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  *(GLFWbool *)(in_RDI + 0x504) = GVar1;
  memset(&stack0xffffffffffffff50,0,0x70);
  _glfwGrabErrorHandlerX11();
  *(Window *)(in_RDI + 0x4e8) = _glfw.x11.root;
  window_00 = (_GLFWwindow *)&stack0xffffffffffffff50;
  xpos_00 = (int *)0x2808;
  WVar4 = (*_glfw.x11.xlib.CreateWindow)
                    (_glfw.x11.display,_glfw.x11.root,local_38,local_3c,local_30,local_34,0,in_ECX,1
                     ,in_RDX,0x2808,(XSetWindowAttributes *)window_00);
  *(Window *)(in_RDI + 0x4e0) = WVar4;
  _glfwReleaseErrorHandlerX11();
  if (*(long *)(in_RDI + 0x4e0) == 0) {
    _glfwInputErrorX11(in_stack_000002b4,in_stack_000002a8);
    local_c = 0;
  }
  else {
    (*_glfw.x11.xlib.SaveContext)
              (_glfw.x11.display,*(XID *)(in_RDI + 0x4e0),_glfw.x11.context,in_RDI);
    if (in_RSI[8] == 0) {
      _glfwSetWindowDecoratedX11(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    }
    if ((_glfw.x11.NET_WM_STATE != 0) && (*(long *)(in_RDI + 0x50) == 0)) {
      in_stack_ffffffffffffff34 = 0;
      if (in_RSI[0xb] != 0) {
        if (_glfw.x11.NET_WM_STATE_ABOVE != 0) {
          in_stack_ffffffffffffff38 = (int *)_glfw.x11.NET_WM_STATE_ABOVE;
        }
        in_stack_ffffffffffffff34 = (uint)(_glfw.x11.NET_WM_STATE_ABOVE != 0);
      }
      if (((in_RSI[0xc] != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
         (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
        iVar9 = in_stack_ffffffffffffff34 + 1;
        *(Atom *)(&stack0xffffffffffffff38 + (long)(int)in_stack_ffffffffffffff34 * 8) =
             _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + 2;
        *(Atom *)(&stack0xffffffffffffff38 + (long)iVar9 * 8) =
             _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        in_RDI[0x500] = '\x01';
        in_RDI[0x501] = '\0';
        in_RDI[0x502] = '\0';
        in_RDI[0x503] = '\0';
      }
      if (in_stack_ffffffffffffff34 != 0) {
        (*_glfw.x11.xlib.ChangeProperty)
                  (_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),_glfw.x11.NET_WM_STATE,4,0x20,0,
                   &stack0xffffffffffffff38,in_stack_ffffffffffffff34);
      }
    }
    title = (char *)_glfw.x11.WM_DELETE_WINDOW;
    window_01 = (_GLFWwindow *)_glfw.x11.NET_WM_PING;
    (*_glfw.x11.xlib.SetWMProtocols)
              (_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),(Atom *)&stack0xffffffffffffff18,2);
    _Var2 = getpid();
    local_f0 = (long)_Var2;
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),_glfw.x11.NET_WM_PID,6,0x20,0,
               (uchar *)&local_f0,1);
    if ((_glfw.x11.NET_WM_WINDOW_TYPE != 0) && (_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL != 0)) {
      local_f8 = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
      (*_glfw.x11.xlib.ChangeProperty)
                (_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),_glfw.x11.NET_WM_WINDOW_TYPE,4,0x20,0
                 ,(uchar *)&local_f8,1);
    }
    pXVar5 = (*_glfw.x11.xlib.AllocWMHints)();
    if (pXVar5 == (XWMHints *)0x0) {
      _glfwInputError(0x10005,"X11: Failed to allocate WM hints");
      local_c = 0;
    }
    else {
      pXVar5->flags = 2;
      pXVar5->initial_state = 1;
      (*_glfw.x11.xlib.SetWMHints)(_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),pXVar5);
      (*_glfw.x11.xlib.Free)(pXVar5);
      pXVar6 = (*_glfw.x11.xlib.AllocSizeHints)();
      if (pXVar6 == (XSizeHints *)0x0) {
        _glfwInputError(0x10005,"X11: Failed to allocate size hints");
        local_c = 0;
      }
      else {
        if (in_RSI[6] == 0) {
          pXVar6->flags = pXVar6->flags | 0x30;
          pXVar6->max_width = local_30;
          pXVar6->min_width = local_30;
          pXVar6->max_height = local_34;
          pXVar6->min_height = local_34;
        }
        if ((*in_RSI != -0x80000000) && (in_RSI[1] != -0x80000000)) {
          pXVar6->flags = pXVar6->flags | 4;
          pXVar6->x = 0;
          pXVar6->y = 0;
        }
        pXVar6->flags = pXVar6->flags | 0x200;
        pXVar6->win_gravity = 10;
        (*_glfw.x11.xlib.SetWMNormalHints)(_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),pXVar6);
        (*_glfw.x11.xlib.Free)(pXVar6);
        pXVar7 = (*_glfw.x11.xlib.AllocClassHint)();
        sVar8 = strlen((char *)(in_RSI + 0x92));
        if ((sVar8 == 0) || (sVar8 = strlen((char *)(in_RSI + 0x52)), sVar8 == 0)) {
          __s = getenv("RESOURCE_NAME");
          if ((__s == (char *)0x0) || (sVar8 = strlen(__s), sVar8 == 0)) {
            sVar8 = strlen(*(char **)(in_RSI + 4));
            if (sVar8 == 0) {
              pXVar7->res_name = "glfw-application";
            }
            else {
              pXVar7->res_name = *(char **)(in_RSI + 4);
            }
          }
          else {
            pXVar7->res_name = __s;
          }
          sVar8 = strlen(*(char **)(in_RSI + 4));
          if (sVar8 == 0) {
            pXVar7->res_class = "GLFW-Application";
          }
          else {
            pXVar7->res_class = *(char **)(in_RSI + 4);
          }
        }
        else {
          pXVar7->res_name = (char *)(in_RSI + 0x92);
          pXVar7->res_class = (char *)(in_RSI + 0x52);
        }
        (*_glfw.x11.xlib.SetClassHint)(_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),pXVar7);
        (*_glfw.x11.xlib.Free)(pXVar7);
        (*_glfw.x11.xlib.ChangeProperty)
                  (_glfw.x11.display,*(Window *)(in_RDI + 0x4e0),_glfw.x11.XdndAware,4,0x20,0,
                   &stack0xfffffffffffffee0,1);
        if (_glfw.x11.im != (XIM)0x0) {
          _glfwCreateInputContextX11(in_stack_ffffffffffffff68);
        }
        _glfwSetWindowTitleX11(window_01,title);
        _glfwGetWindowPosX11(window_00,xpos_00,(int *)in_RDX);
        _glfwGetWindowSizeX11
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   (int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        local_c = 1;
      }
    }
  }
  return local_c;
}

Assistant:

static int createNativeWindow(_GLFWwindow* window,
                              const _GLFWwndconfig* wndconfig,
                              const _GLFWfbconfig* fbconfig)
{
    if (window->monitor)
        fitToMonitor(window);
    else
    {
        if (wndconfig->xpos == GLFW_ANY_POSITION && wndconfig->ypos == GLFW_ANY_POSITION)
        {
            window->null.xpos = 17;
            window->null.ypos = 17;
        }
        else
        {
            window->null.xpos = wndconfig->xpos;
            window->null.ypos = wndconfig->ypos;
        }

        window->null.width = wndconfig->width;
        window->null.height = wndconfig->height;
    }

    window->null.visible = wndconfig->visible;
    window->null.decorated = wndconfig->decorated;
    window->null.maximized = wndconfig->maximized;
    window->null.floating = wndconfig->floating;
    window->null.transparent = fbconfig->transparent;
    window->null.opacity = 1.f;

    return GLFW_TRUE;
}